

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O0

int32_t icu_63::GreekUpper::toUpper
                  (uint32_t options,UChar *dest,int32_t destCapacity,UChar *src,int32_t srcLength,
                  Edits *edits,UErrorCode *errorCode)

{
  UBool UVar1;
  bool local_83;
  bool local_82;
  bool local_81;
  UChar *local_80;
  UChar *s;
  int32_t newLength;
  int32_t oldLength;
  int32_t i2;
  UBool change;
  uint uStack_64;
  UBool addTonos;
  uint32_t diacriticData;
  int32_t numYpogegrammeni;
  uint32_t upper;
  uint32_t data;
  int32_t type;
  uint32_t nextState;
  int iStack_48;
  uint16_t __c2;
  UChar32 c;
  int32_t nextIndex;
  int32_t i;
  uint32_t state;
  int32_t destIndex;
  Edits *edits_local;
  UChar *pUStack_28;
  int32_t srcLength_local;
  UChar *src_local;
  UChar *pUStack_18;
  int32_t destCapacity_local;
  UChar *dest_local;
  uint32_t options_local;
  
  i = 0;
  nextIndex = 0;
  c = 0;
  _state = edits;
  edits_local._4_4_ = srcLength;
  pUStack_28 = src;
  src_local._4_4_ = destCapacity;
  pUStack_18 = dest;
  dest_local._0_4_ = options;
  do {
    if (edits_local._4_4_ <= c) {
      return i;
    }
    iStack_48 = c + 1;
    nextState = (uint32_t)(ushort)pUStack_28[c];
    if ((((nextState & 0xfffffc00) == 0xd800) && (iStack_48 != edits_local._4_4_)) &&
       (type._2_2_ = pUStack_28[iStack_48], (type._2_2_ & 0xfc00U) == 0xdc00)) {
      iStack_48 = c + 2;
      nextState = nextState * 0x400 + (uint)(ushort)type._2_2_ + 0xfca02400;
    }
    data = 0;
    upper = ucase_getTypeOrIgnorable_63(nextState);
    if ((upper & 4) == 0) {
      if (upper != 0) {
        data = data | 1;
      }
    }
    else {
      data = nextIndex & 1U | data;
    }
    numYpogegrammeni = getLetterData(nextState);
    if (numYpogegrammeni == 0) {
      nextState = ucase_toFullUpper_63
                            (nextState,(UCaseContextIterator *)0x0,(void *)0x0,&local_80,4);
      i = anon_unknown_10::appendResult
                    (pUStack_18,i,src_local._4_4_,nextState,local_80,iStack_48 - c,
                     (uint32_t)dest_local,_state);
      if (i < 0) {
        *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
      }
    }
    else {
      diacriticData = numYpogegrammeni & 0x3ff;
      if ((((numYpogegrammeni & 0x1000U) != 0) && ((nextIndex & 2U) != 0)) &&
         ((diacriticData == 0x399 || (diacriticData == 0x3a5)))) {
        numYpogegrammeni = numYpogegrammeni | 0x8000;
      }
      uStack_64 = (uint)((numYpogegrammeni & 0x2000U) != 0);
      while ((iStack_48 < edits_local._4_4_ &&
             (i2 = getDiacriticData((uint)(ushort)pUStack_28[iStack_48]), i2 != 0))) {
        numYpogegrammeni = i2 | numYpogegrammeni;
        if ((i2 & 0x2000U) != 0) {
          uStack_64 = uStack_64 + 1;
        }
        iStack_48 = iStack_48 + 1;
      }
      if ((numYpogegrammeni & 0xd000U) == 0x5000) {
        data = data | 2;
      }
      oldLength._3_1_ = '\0';
      if ((((diacriticData == 0x397) && ((numYpogegrammeni & 0x4000U) != 0)) && (uStack_64 == 0)) &&
         (((nextIndex & 1U) == 0 &&
          (UVar1 = isFollowedByCasedLetter(pUStack_28,iStack_48,edits_local._4_4_), UVar1 == '\0')))
         ) {
        if (c == iStack_48) {
          diacriticData = 0x389;
        }
        else {
          oldLength._3_1_ = '\x01';
        }
      }
      else if ((numYpogegrammeni & 0x8000U) != 0) {
        if (diacriticData == 0x399) {
          diacriticData = 0x3aa;
          numYpogegrammeni = numYpogegrammeni & 0xfffe7fff;
        }
        else if (diacriticData == 0x3a5) {
          diacriticData = 0x3ab;
          numYpogegrammeni = numYpogegrammeni & 0xfffe7fff;
        }
      }
      if ((_state == (Edits *)0x0) && (((uint32_t)dest_local & 0x4000) == 0)) {
        oldLength._2_1_ = 1;
      }
      else {
        local_81 = (ushort)pUStack_28[c] != diacriticData || 0 < (int)uStack_64;
        oldLength._2_1_ = local_81;
        newLength = c + 1;
        if ((numYpogegrammeni & 0x18000U) != 0) {
          local_82 = true;
          if (newLength < iStack_48) {
            local_82 = pUStack_28[newLength] != L'̈';
          }
          oldLength._2_1_ = local_81 | local_82;
          newLength = c + 2;
        }
        if (oldLength._3_1_ != '\0') {
          local_83 = true;
          if (newLength < iStack_48) {
            local_83 = pUStack_28[newLength] != L'́';
          }
          oldLength._2_1_ = oldLength._2_1_ | local_83;
          newLength = newLength + 1;
        }
        s._4_4_ = iStack_48 - c;
        s._0_4_ = (newLength - c) + uStack_64;
        oldLength._2_1_ = oldLength._2_1_ | s._4_4_ != (int)s;
        if (oldLength._2_1_ == 0) {
          if (_state != (Edits *)0x0) {
            Edits::addUnchanged(_state,s._4_4_);
          }
          oldLength._2_1_ = ((uint32_t)dest_local & 0x4000) == 0;
        }
        else if (_state != (Edits *)0x0) {
          Edits::addReplace(_state,s._4_4_,(int)s);
        }
      }
      if (oldLength._2_1_ != 0) {
        i = anon_unknown_10::appendUChar(pUStack_18,i,src_local._4_4_,(UChar)diacriticData);
        if ((-1 < i) && ((numYpogegrammeni & 0x18000U) != 0)) {
          i = anon_unknown_10::appendUChar(pUStack_18,i,src_local._4_4_,L'̈');
        }
        if ((-1 < i) && (oldLength._3_1_ != '\0')) {
          i = anon_unknown_10::appendUChar(pUStack_18,i,src_local._4_4_,L'́');
        }
        for (; -1 < i && 0 < (int)uStack_64; uStack_64 = uStack_64 - 1) {
          i = anon_unknown_10::appendUChar(pUStack_18,i,src_local._4_4_,L'Ι');
        }
        if (i < 0) {
          *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
          return 0;
        }
      }
    }
    c = iStack_48;
    nextIndex = data;
  } while( true );
}

Assistant:

int32_t toUpper(uint32_t options,
                UChar *dest, int32_t destCapacity,
                const UChar *src, int32_t srcLength,
                Edits *edits,
                UErrorCode &errorCode) {
    int32_t destIndex=0;
    uint32_t state = 0;
    for (int32_t i = 0; i < srcLength;) {
        int32_t nextIndex = i;
        UChar32 c;
        U16_NEXT(src, nextIndex, srcLength, c);
        uint32_t nextState = 0;
        int32_t type = ucase_getTypeOrIgnorable(c);
        if ((type & UCASE_IGNORABLE) != 0) {
            // c is case-ignorable
            nextState |= (state & AFTER_CASED);
        } else if (type != UCASE_NONE) {
            // c is cased
            nextState |= AFTER_CASED;
        }
        uint32_t data = getLetterData(c);
        if (data > 0) {
            uint32_t upper = data & UPPER_MASK;
            // Add a dialytika to this iota or ypsilon vowel
            // if we removed a tonos from the previous vowel,
            // and that previous vowel did not also have (or gain) a dialytika.
            // Adding one only to the final vowel in a longer sequence
            // (which does not occur in normal writing) would require lookahead.
            // Set the same flag as for preserving an existing dialytika.
            if ((data & HAS_VOWEL) != 0 && (state & AFTER_VOWEL_WITH_ACCENT) != 0 &&
                    (upper == 0x399 || upper == 0x3A5)) {
                data |= HAS_DIALYTIKA;
            }
            int32_t numYpogegrammeni = 0;  // Map each one to a trailing, spacing, capital iota.
            if ((data & HAS_YPOGEGRAMMENI) != 0) {
                numYpogegrammeni = 1;
            }
            // Skip combining diacritics after this Greek letter.
            while (nextIndex < srcLength) {
                uint32_t diacriticData = getDiacriticData(src[nextIndex]);
                if (diacriticData != 0) {
                    data |= diacriticData;
                    if ((diacriticData & HAS_YPOGEGRAMMENI) != 0) {
                        ++numYpogegrammeni;
                    }
                    ++nextIndex;
                } else {
                    break;  // not a Greek diacritic
                }
            }
            if ((data & HAS_VOWEL_AND_ACCENT_AND_DIALYTIKA) == HAS_VOWEL_AND_ACCENT) {
                nextState |= AFTER_VOWEL_WITH_ACCENT;
            }
            // Map according to Greek rules.
            UBool addTonos = FALSE;
            if (upper == 0x397 &&
                    (data & HAS_ACCENT) != 0 &&
                    numYpogegrammeni == 0 &&
                    (state & AFTER_CASED) == 0 &&
                    !isFollowedByCasedLetter(src, nextIndex, srcLength)) {
                // Keep disjunctive "or" with (only) a tonos.
                // We use the same "word boundary" conditions as for the Final_Sigma test.
                if (i == nextIndex) {
                    upper = 0x389;  // Preserve the precomposed form.
                } else {
                    addTonos = TRUE;
                }
            } else if ((data & HAS_DIALYTIKA) != 0) {
                // Preserve a vowel with dialytika in precomposed form if it exists.
                if (upper == 0x399) {
                    upper = 0x3AA;
                    data &= ~HAS_EITHER_DIALYTIKA;
                } else if (upper == 0x3A5) {
                    upper = 0x3AB;
                    data &= ~HAS_EITHER_DIALYTIKA;
                }
            }

            UBool change;
            if (edits == nullptr && (options & U_OMIT_UNCHANGED_TEXT) == 0) {
                change = TRUE;  // common, simple usage
            } else {
                // Find out first whether we are changing the text.
                change = src[i] != upper || numYpogegrammeni > 0;
                int32_t i2 = i + 1;
                if ((data & HAS_EITHER_DIALYTIKA) != 0) {
                    change |= i2 >= nextIndex || src[i2] != 0x308;
                    ++i2;
                }
                if (addTonos) {
                    change |= i2 >= nextIndex || src[i2] != 0x301;
                    ++i2;
                }
                int32_t oldLength = nextIndex - i;
                int32_t newLength = (i2 - i) + numYpogegrammeni;
                change |= oldLength != newLength;
                if (change) {
                    if (edits != NULL) {
                        edits->addReplace(oldLength, newLength);
                    }
                } else {
                    if (edits != NULL) {
                        edits->addUnchanged(oldLength);
                    }
                    // Write unchanged text?
                    change = (options & U_OMIT_UNCHANGED_TEXT) == 0;
                }
            }

            if (change) {
                destIndex=appendUChar(dest, destIndex, destCapacity, (UChar)upper);
                if (destIndex >= 0 && (data & HAS_EITHER_DIALYTIKA) != 0) {
                    destIndex=appendUChar(dest, destIndex, destCapacity, 0x308);  // restore or add a dialytika
                }
                if (destIndex >= 0 && addTonos) {
                    destIndex=appendUChar(dest, destIndex, destCapacity, 0x301);
                }
                while (destIndex >= 0 && numYpogegrammeni > 0) {
                    destIndex=appendUChar(dest, destIndex, destCapacity, 0x399);
                    --numYpogegrammeni;
                }
                if(destIndex<0) {
                    errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                    return 0;
                }
            }
        } else {
            const UChar *s;
            c=ucase_toFullUpper(c, NULL, NULL, &s, UCASE_LOC_GREEK);
            destIndex = appendResult(dest, destIndex, destCapacity, c, s,
                                     nextIndex - i, options, edits);
            if (destIndex < 0) {
                errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
                return 0;
            }
        }
        i = nextIndex;
        state = nextState;
    }

    return destIndex;
}